

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::EndsWith::match(EndsWith *this,string *expr)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  string local_30 [32];
  
  CasedString::adjustString((CasedString *)local_30,in_RDI);
  bVar1 = endsWith(in_RDI,in_RSI);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return endsWith( m_data.adjustString( expr ), m_data.m_str );
            }